

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontenginemultifontconfig.cpp
# Opt level: O1

FcPattern * __thiscall
QFontEngineMultiFontConfig::getMatchPatternForFallback
          (QFontEngineMultiFontConfig *this,int fallBackIndex)

{
  QList<_FcPattern_*> *this_00;
  QString *pQVar1;
  undefined8 uVar2;
  QArrayData *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  FcResult result;
  QArrayData *local_70;
  char16_t *local_68;
  qsizetype local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (long)(int)(this->super_QFontEngineMulti).m_fallbackFamilies.d.size;
  this_00 = &this->cachedMatchPatterns;
  if ((this->cachedMatchPatterns).d.size < lVar4) {
    QList<_FcPattern_*>::resize(this_00,lVar4);
  }
  lVar4 = (long)fallBackIndex;
  pQVar3 = (QArrayData *)(this->cachedMatchPatterns).d.ptr[lVar4];
  if (pQVar3 == (QArrayData *)0x0) {
    uVar2 = FcPatternCreate();
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (this->super_QFontEngineMulti).m_fallbackFamilies.d.ptr;
    local_70 = &(pQVar1[lVar4].d.d)->super_QArrayData;
    local_68 = pQVar1[lVar4].d.ptr;
    local_60 = pQVar1[lVar4].d.size;
    if (local_70 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_70->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_70->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::toUtf8_helper(&local_58);
    if (local_70 != (QArrayData *)0x0) {
      LOCK();
      (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70,2,0x10);
      }
    }
    if ((&(local_58.d.d)->super_QArrayData == (QArrayData *)0x0) ||
       (1 < ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((longlong)&local_58,(AllocationOption)local_58.d.size);
    }
    FcPatternAdd(uVar2,"family",3,local_58.d.ptr,1);
    pQVar3 = (QArrayData *)FcFontMatch(0,uVar2);
    local_70 = pQVar3;
    QtPrivate::QPodArrayOps<_FcPattern*>::emplace<_FcPattern*&>
              ((QPodArrayOps<_FcPattern*> *)this_00,lVar4,(_FcPattern **)&local_70);
    QList<_FcPattern_*>::begin(this_00);
    FcPatternDestroy(uVar2);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (FcPattern *)pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

FcPattern * QFontEngineMultiFontConfig::getMatchPatternForFallback(int fallBackIndex) const
{
    Q_ASSERT(fallBackIndex < fallbackFamilyCount());
    if (fallbackFamilyCount() > cachedMatchPatterns.size())
        cachedMatchPatterns.resize(fallbackFamilyCount());
    FcPattern *ret = cachedMatchPatterns.at(fallBackIndex);
    if (ret)
        return ret;
    FcPattern *requestPattern = FcPatternCreate();
    FcValue value;
    value.type = FcTypeString;
    QByteArray cs = fallbackFamilyAt(fallBackIndex).toUtf8();
    value.u.s = reinterpret_cast<const FcChar8 *>(cs.data());
    FcPatternAdd(requestPattern, FC_FAMILY, value, true);
    FcResult result;
    ret = FcFontMatch(nullptr, requestPattern, &result);
    cachedMatchPatterns.insert(fallBackIndex, ret);
    FcPatternDestroy(requestPattern);
    return ret;
}